

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-option-parser.cc
# Opt level: O0

void __thiscall
OptionParser_ShortAndLongFlag_Test::~OptionParser_ShortAndLongFlag_Test
          (OptionParser_ShortAndLongFlag_Test *this)

{
  OptionParser_ShortAndLongFlag_Test *this_local;
  
  ~OptionParser_ShortAndLongFlag_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(OptionParser, ShortAndLongFlag) {
  int count = 0;
  OptionParser parser("prog", "desc");
  parser.AddOption('f', "flag", "help", [&]() { ++count; });
  const char* args[] = {"prog name", "-f", "--flag", "-f", "--flag"};
  parser.Parse(5, const_cast<char**>(args));
  EXPECT_EQ(4, count);
}